

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaPValAttrFormDefault(xmlChar *value,int *flags,int flagQualified)

{
  int iVar1;
  
  iVar1 = xmlStrEqual(value,"qualified");
  if (iVar1 == 0) {
    iVar1 = xmlStrEqual(value,(xmlChar *)"unqualified");
    if (iVar1 == 0) {
      return 1;
    }
  }
  else if ((*flags & flagQualified) == 0) {
    *flags = *flags | flagQualified;
  }
  return 0;
}

Assistant:

static int
xmlSchemaPValAttrFormDefault(const xmlChar *value,
			     int *flags,
			     int flagQualified)
{
    if (xmlStrEqual(value, BAD_CAST "qualified")) {
	if  ((*flags & flagQualified) == 0)
	    *flags |= flagQualified;
    } else if (!xmlStrEqual(value, BAD_CAST "unqualified"))
	return (1);

    return (0);
}